

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.hpp
# Opt level: O0

Comparison __thiscall Kernel::TermList::Top::compare(Top *this,Top *other)

{
  Comparison CVar1;
  
  CVar1 = Lib::Coproduct<Kernel::VarNumber,_Kernel::SymbolId>::compare(&this->_inner,&other->_inner)
  ;
  return CVar1;
}

Assistant:

Lib::Comparison compare(Top const& other) const 
    { return _inner.compare(other._inner); }